

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

char * ConvolutionReverb_GetSampleName(int index)

{
  IRSample *pIVar1;
  IRSample *s;
  MutexScopeLock mutexScope;
  char *pcStack_10;
  int index_local;
  
  if (index < 0) {
    pcStack_10 = "Synthetic";
  }
  else if (index < 0x10) {
    mutexScope.mutex._4_4_ = index;
    MutexScopeLock::MutexScopeLock
              ((MutexScopeLock *)&s,(Mutex *)ConvolutionReverb::sampleMutex,true);
    pIVar1 = ConvolutionReverb::GetIRSample(mutexScope.mutex._4_4_);
    if (pIVar1->allocated == 0) {
      pcStack_10 = "Not set";
    }
    else {
      pcStack_10 = pIVar1->name;
    }
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&s);
  }
  else {
    pcStack_10 = "Not set";
  }
  return pcStack_10;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API const char* ConvolutionReverb_GetSampleName(int index)
{
    if (index < 0)
        return "Synthetic";

    if (index < ConvolutionReverb::MAXSAMPLE)
    {
        MutexScopeLock mutexScope(ConvolutionReverb::sampleMutex);
        ConvolutionReverb::IRSample& s = ConvolutionReverb::GetIRSample(index);
        if (!s.allocated)
            return "Not set";
        return s.name;
    }

    return "Not set";
}